

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O1

Abc_Cex_t *
Gia_ManCexMin(Gia_Man_t *p,Abc_Cex_t *pCex,int iFrameStart,int nRealPis,int fJustMax,int fUseAll,
             int fVerbose)

{
  int *__ptr;
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  
  iVar2 = p->vCis->nSize - p->nRegs;
  if (pCex->nPis != iVar2) {
    __assert_fail("pCex->nPis == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                  ,0x142,
                  "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
  }
  if (pCex->iPo < p->vCos->nSize - p->nRegs) {
    if ((-1 < iFrameStart) && (iFrameStart <= pCex->iFrame)) {
      if (nRealPis < iVar2) {
        Gia_ManAnnotateUnrolling(p,pCex,fJustMax);
        if (nRealPis < 0) {
          iVar2 = pCex->iFrame;
          if (iFrameStart <= pCex->iFrame) {
            do {
              pGVar3 = Gia_ManCreateUnate(p,pCex,iVar2,-1,fUseAll);
              printf("%3d : ");
              Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
              if (fVerbose != 0) {
                Gia_AigerWrite(pGVar3,"temp.aig",0,0);
              }
              Gia_ManStop(pGVar3);
              bVar1 = iFrameStart < iVar2;
              iVar2 = iVar2 + -1;
            } while (bVar1);
          }
        }
        else {
          pGVar3 = Gia_ManCreateUnate(p,pCex,iFrameStart,nRealPis,fUseAll);
          printf("%3d : ");
          Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
          if (fVerbose != 0) {
            Gia_AigerWrite(pGVar3,"temp.aig",0,0);
          }
          Gia_ManStop(pGVar3);
        }
        if (p->vTruths != (Vec_Int_t *)0x0) {
          __ptr = p->vTruths->pArray;
          if (__ptr != (int *)0x0) {
            free(__ptr);
            p->vTruths->pArray = (int *)0x0;
          }
          if (p->vTruths != (Vec_Int_t *)0x0) {
            free(p->vTruths);
            p->vTruths = (Vec_Int_t *)0x0;
          }
        }
        p->nTtWords = 0;
        return (Abc_Cex_t *)0x0;
      }
      __assert_fail("nRealPis < Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                    ,0x148,
                    "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
    }
    __assert_fail("iFrameStart >= 0 && iFrameStart <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                  ,0x146,
                  "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
  }
  __assert_fail("pCex->iPo < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                ,0x144,"Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)"
               );
}

Assistant:

Abc_Cex_t * Gia_ManCexMin( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrameStart, int nRealPis, int fJustMax, int fUseAll, int fVerbose )
{
    Gia_Man_t * pNew;
    int f, RetValue;
    // check CEX
    assert( pCex->nPis == Gia_ManPiNum(p) );
//    assert( pCex->nRegs == Gia_ManRegNum(p) );
    assert( pCex->iPo < Gia_ManPoNum(p) );
    // check frames
    assert( iFrameStart >= 0 && iFrameStart <= pCex->iFrame );
    // check primary inputs
    assert( nRealPis < Gia_ManPiNum(p) );
    // prepare
    RetValue = Gia_ManAnnotateUnrolling( p, pCex, fJustMax );
    if ( nRealPis >= 0 ) // refinement
    {
        pNew = Gia_ManCreateUnate( p, pCex, iFrameStart, nRealPis, fUseAll );
        printf( "%3d : ", iFrameStart );
        Gia_ManPrintStats( pNew, NULL );
        if ( fVerbose )
            Gia_AigerWrite( pNew, "temp.aig", 0, 0 );
        Gia_ManStop( pNew );
    }
    else // CEX min
    {
        for ( f = pCex->iFrame; f >= iFrameStart; f-- )
        {
            pNew = Gia_ManCreateUnate( p, pCex, f, -1, fUseAll );
            printf( "%3d : ", f );
            Gia_ManPrintStats( pNew, NULL );
            if ( fVerbose )
                Gia_AigerWrite( pNew, "temp.aig", 0, 0 );
            Gia_ManStop( pNew );
        }
    }
    Vec_IntFreeP( &p->vTruths );
    p->nTtWords = 0;
    return NULL;
}